

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void read_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  od_ec_dec *dec;
  aom_cdf_prob *icdf;
  uint8_t uVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *pFVar6;
  short sVar7;
  int8_t iVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  int literal;
  uint uVar13;
  uint uVar14;
  MB_MODE_INFO *mbmi;
  uint uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  if ((cm->delta_q_info).delta_q_present_flag == 0) {
    return;
  }
  pMVar5 = *xd->mi;
  bVar18 = (cm->seq_params->mib_size - 1U & (xd->mi_row | xd->mi_col)) == 0;
  pFVar6 = xd->tile_ctx;
  if (pMVar5->bsize == cm->seq_params->sb_size) {
    if (pMVar5->skip_txfm == '\0' && bVar18) {
LAB_0017726d:
      icdf = pFVar6->delta_q_cdf;
      dec = &r->ec;
      iVar12 = od_ec_decode_cdf_q15(dec,icdf,4);
      if (r->allow_update_cdf != '\0') {
        uVar3 = pFVar6->delta_q_cdf[4];
        bVar11 = (char)(uVar3 >> 4) + 5;
        lVar17 = 0;
        do {
          uVar4 = icdf[lVar17];
          if (lVar17 < (char)iVar12) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar11 & 0x1f));
          }
          else {
            sVar7 = -(uVar4 >> (bVar11 & 0x1f));
          }
          icdf[lVar17] = sVar7 + uVar4;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        pFVar6->delta_q_cdf[4] = pFVar6->delta_q_cdf[4] + (ushort)(uVar3 < 0x20);
      }
      if (2 < iVar12) {
        uVar13 = 0;
        uVar15 = 4;
        do {
          iVar12 = od_ec_decode_bool_q15(dec,0x4000);
          uVar13 = uVar13 | iVar12 << ((char)uVar15 - 2U & 0x1f);
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
        uVar16 = 0;
        uVar15 = uVar13;
        if (-1 < (int)uVar13) {
          do {
            iVar12 = od_ec_decode_bool_q15(dec,0x4000);
            uVar16 = uVar16 | iVar12 << ((byte)uVar15 & 0x1f);
            uVar14 = uVar15 + 1;
            uVar15 = uVar15 - 1;
          } while (1 < uVar14);
        }
        iVar12 = (1 << ((char)uVar13 + 1U & 0x1f)) + 1 + uVar16;
      }
      if (iVar12 == 0) {
        iVar10 = 0;
      }
      else {
        iVar9 = od_ec_decode_bool_q15(dec,0x4000);
        iVar10 = -iVar12;
        if (iVar9 == 0) {
          iVar10 = iVar12;
        }
      }
      goto LAB_0017738c;
    }
  }
  else if (bVar18) goto LAB_0017726d;
  iVar10 = 0;
LAB_0017738c:
  iVar12 = iVar10 * (cm->delta_q_info).delta_q_res + xd->current_base_qindex;
  if (0xfe < iVar12) {
    iVar12 = 0xff;
  }
  iVar10 = 1;
  if (1 < iVar12) {
    iVar10 = iVar12;
  }
  xd->current_base_qindex = iVar10;
  if ((cm->delta_q_info).delta_lf_present_flag != 0) {
    iVar12 = xd->mi_col;
    if ((cm->delta_q_info).delta_lf_multi == 0) {
      cVar2 = xd->delta_lf_from_base;
      iVar12 = read_delta_lflevel((AV1_COMMON *)(ulong)*(uint *)&cm->seq_params->sb_size,
                                  (aom_reader *)(ulong)(uint)cm->seq_params->mib_size,
                                  (aom_cdf_prob *)r,(MB_MODE_INFO *)xd->tile_ctx->delta_lf_cdf,
                                  (int)pMVar5,iVar12);
      iVar10 = iVar12 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
      iVar12 = 0x3f;
      if (iVar10 < 0x3f) {
        iVar12 = iVar10;
      }
      iVar8 = -0x3f;
      if (-0x3f < iVar12) {
        iVar8 = (int8_t)iVar12;
      }
      xd->delta_lf_from_base = iVar8;
      pMVar5->delta_lf_from_base = iVar8;
    }
    else {
      uVar1 = cm->seq_params->monochrome;
      mbmi = (MB_MODE_INFO *)xd->tile_ctx->delta_lf_multi_cdf;
      lVar17 = 0;
      do {
        cVar2 = xd->delta_lf[lVar17];
        iVar10 = read_delta_lflevel((AV1_COMMON *)(ulong)*(uint *)&cm->seq_params->sb_size,
                                    (aom_reader *)(ulong)(uint)cm->seq_params->mib_size,
                                    (aom_cdf_prob *)r,mbmi,(int)pMVar5,iVar12);
        iVar10 = iVar10 * (cm->delta_q_info).delta_lf_res + (int)cVar2;
        if (0x3e < iVar10) {
          iVar10 = 0x3f;
        }
        if (iVar10 < -0x3e) {
          iVar10 = -0x3f;
        }
        xd->delta_lf[lVar17] = (int8_t)iVar10;
        pMVar5->delta_lf[lVar17] = (int8_t)iVar10;
        lVar17 = lVar17 + 1;
        mbmi = (MB_MODE_INFO *)((long)mbmi->mv + 2);
      } while ((ulong)(uVar1 == '\0') * 2 + 2 != lVar17);
    }
  }
  return;
}

Assistant:

static void read_delta_q_params(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                aom_reader *r) {
  DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    MB_MODE_INFO *const mbmi = xd->mi[0];
    xd->current_base_qindex +=
        read_delta_qindex(cm, xd, r, mbmi) * delta_q_info->delta_q_res;
    /* Normative: Clamp to [1,MAXQ] to not interfere with lossless mode */
    xd->current_base_qindex = clamp(xd->current_base_qindex, 1, MAXQ);
    FRAME_CONTEXT *const ec_ctx = xd->tile_ctx;
    if (delta_q_info->delta_lf_present_flag) {
      const int mi_row = xd->mi_row;
      const int mi_col = xd->mi_col;
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int tmp_lvl =
              xd->delta_lf[lf_id] +
              read_delta_lflevel(cm, r, ec_ctx->delta_lf_multi_cdf[lf_id], mbmi,
                                 mi_col, mi_row) *
                  delta_q_info->delta_lf_res;
          mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id] =
              clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
        }
      } else {
        const int tmp_lvl = xd->delta_lf_from_base +
                            read_delta_lflevel(cm, r, ec_ctx->delta_lf_cdf,
                                               mbmi, mi_col, mi_row) *
                                delta_q_info->delta_lf_res;
        mbmi->delta_lf_from_base = xd->delta_lf_from_base =
            clamp(tmp_lvl, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
      }
    }
  }
}